

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O2

UnknownFieldSet * __thiscall
google::protobuf::UnknownFieldSet::AddGroup(UnknownFieldSet *this,int number)

{
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *this_00;
  UnknownField field;
  
  field.type_ = 4;
  field.number_ = number;
  field.data_.group_ = (UnknownFieldSet *)operator_new(8);
  (field.data_.group_)->fields_ =
       (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)
       0x0;
  this_00 = this->fields_;
  if (this_00 ==
      (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)0x0
     ) {
    this_00 = (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               *)operator_new(0x18);
    (this_00->
    super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this_00->
    super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this_00->
    super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this->fields_ = this_00;
  }
  std::vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>::
  push_back(this_00,&field);
  return (UnknownFieldSet *)field.data_.varint_;
}

Assistant:

UnknownFieldSet* UnknownFieldSet::AddGroup(int number) {
  UnknownField field;
  field.number_ = number;
  field.SetType(UnknownField::TYPE_GROUP);
  field.data_.group_ = new UnknownFieldSet;
  if (fields_ == NULL) fields_ = new std::vector<UnknownField>();
  fields_->push_back(field);
  return field.data_.group_;
}